

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildProfiledElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  SymOpnd *srcOpnd;
  RegOpnd *dstOpnd;
  JITTimeProfileInfo *this_01;
  LdLenInfo *pLVar5;
  Instr *this_02;
  JitProfilingInstr *pJVar6;
  ProfiledInstr *pPVar7;
  OpCode local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  bool local_31 [3];
  OpCode newOpcode_local;
  ValueType arrayType;
  bool wasNotProfiled;
  
  local_36 = newOpcode;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d0,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004977a0;
    *puVar4 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(&local_36);
  if (local_36 != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d4,"(newOpcode == Js::OpCode::LdLen_A)",
                       "newOpcode == Js::OpCode::LdLen_A");
    if (!bVar2) {
LAB_004977a0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId = JITTimeFunctionBody::GetPropertyIdFromCacheId(this_00,inlineCacheIndex);
  srcOpnd = BuildFieldOpnd(this,local_36,instance,propertyId,0xffffffff,PropertyKindData,
                           inlineCacheIndex);
  dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,false);
  local_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  bVar2 = Func::HasProfileInfo(this->m_func);
  if (bVar2) {
    this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
    pLVar5 = JITTimeProfileInfo::GetLdLenInfo(this_01,profileId);
    local_34.field_0 = (pLVar5->arrayType).field_0.field_0;
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_34.field_0);
    if ((bVar2) && (bVar2 = AllowNativeArrayProfileInfo(this), !bVar2)) {
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
    }
    IR::Opnd::SetValueType(&srcOpnd->super_Opnd,(ValueType)local_34.field_0);
    BVar3 = Func::HasTry(this->m_func->topFunc);
    if (BVar3 == 0) {
      local_31[0] = false;
      if (profileId != 0xffff) goto LAB_00497730;
    }
    else {
      bVar2 = Func::DoOptimizeTry(this->m_func->topFunc);
      local_31[0] = false;
      if ((profileId != 0xffff) && (bVar2)) {
LAB_00497730:
        local_31[0] = false;
        this_02 = BuildProfiledFieldLoad(this,local_36,dstOpnd,srcOpnd,inlineCacheIndex,local_31);
        if (this_02 != (Instr *)0x0) {
          if (this_02->m_kind == InstrKindProfiled) {
            pPVar7 = IR::Instr::AsProfiledInstr(this_02);
            (pPVar7->u).field_3.ldLenInfoData.f1 = (TSize)(pLVar5->arrayType).field_0;
            *(anon_union_1_2_471f577c_for_LdLenInfo_1 *)((long)&pPVar7->u + 6) = pLVar5->field_1;
            pPVar7 = IR::Instr::AsProfiledInstr(this_02);
            (pPVar7->u).field_3.ldLenInfoData.f1 = (TSize)local_34;
          }
          else if (this_02->m_kind == InstrKindJitProfiling) {
            pJVar6 = IR::Instr::AsJitProfilingInstr(this_02);
            pJVar6->profileId = profileId;
          }
          goto LAB_004976eb;
        }
      }
    }
  }
  else {
    local_31[0] = false;
  }
  this_02 = IR::Instr::New(local_36,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
LAB_004976eb:
  AddInstr(this,this_02,offset);
  if ((local_31[0] == true) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,this_02);
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    Assert(newOpcode == Js::OpCode::LdLen_A);

    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);
    IR::SymOpnd * fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(regSlot);

    bool isProfiled = (profileId != Js::Constants::NoProfileId);
    ValueType arrayType = ValueType::Uninitialized;
    const Js::LdLenInfo * ldLenInfo = nullptr;

    if (m_func->HasProfileInfo())
    {
        ldLenInfo = m_func->GetReadOnlyProfileInfo()->GetLdLenInfo(profileId);
        arrayType = (ldLenInfo->GetArrayType());
        if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);
        }

        fieldSymOpnd->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiled = false;
        }
    }
    else
    {
        isProfiled = false;
    }
    
    bool wasNotProfiled = false;
    IR::Instr *instr = nullptr;

    if (isProfiled)
    {
        instr = this->BuildProfiledFieldLoad(newOpcode, dstOpnd, fieldSymOpnd, inlineCacheIndex, &wasNotProfiled);
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, fieldSymOpnd, m_func);
    }
    else if (instr->IsJitProfilingInstr())
    {
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else if (instr->IsProfiledInstr())
    {
        instr->AsProfiledInstr()->u.LdLenInfo() = *ldLenInfo;
        instr->AsProfiledInstr()->u.LdLenInfo().arrayType = arrayType;
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}